

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

JavascriptString *
Js::TMapKey_ConvertKey<Js::JavascriptString*>(ScriptContext *scriptContext,PropertyRecord *key)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PropertyString *pPVar6;
  PropertyRecord *key_local;
  ScriptContext *scriptContext_local;
  
  PVar3 = PropertyRecord::GetPropertyId(key);
  BVar4 = IsInternalPropertyId(PVar3);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2b,"(!IsInternalPropertyId(key->GetPropertyId()))",
                                "!IsInternalPropertyId(key->GetPropertyId())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = PropertyRecord::IsSymbol(key);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2d,"(!key->IsSymbol())","!key->IsSymbol()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  PVar3 = PropertyRecord::GetPropertyId(key);
  pPVar6 = ScriptContext::GetPropertyString(scriptContext,PVar3);
  return &pPVar6->super_JavascriptString;
}

Assistant:

JavascriptString* TMapKey_ConvertKey(ScriptContext* scriptContext, const PropertyRecord* key)
    {
        // String keyed type handlers can't handle InternalPropertyIds because they have no string representation
        // so assert that no code paths convert InternalPropertyIds to PropertyStrings.
        Assert(!IsInternalPropertyId(key->GetPropertyId()));
        // The same is true for symbols - we should not be converting a symbol property into a PropertyString.
        Assert(!key->IsSymbol());

        return scriptContext->GetPropertyString(key->GetPropertyId());
    }